

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O3

void op_addr_rr_post(DisasContext_conflict1 *s,arg_ldst_rr *a,TCGv_i32 addr,int address_offset)

{
  int reg;
  TCGContext_conflict1 *s_00;
  TCGTemp *a3;
  uintptr_t o;
  TCGContext_conflict1 *tcg_ctx;
  uintptr_t o_2;
  TCGv_i32 var;
  
  s_00 = s->uc->tcg_ctx;
  if (a->p == 0) {
    reg = a->rm;
    a3 = tcg_temp_new_internal_aarch64(s_00,TCG_TYPE_I32,false);
    var = (TCGv_i32)((long)a3 - (long)s_00);
    load_reg_var(s,var,reg);
    gen_arm_shift_im(s_00,var,a->shtype,a->shimm,0);
    if (a->u == 0) {
      tcg_gen_sub_i32(s_00,addr,addr,var);
    }
    else {
      tcg_gen_op3_aarch64(s_00,INDEX_op_add_i32,(TCGArg)(addr + (long)&s_00->pool_cur),
                          (TCGArg)(addr + (long)&s_00->pool_cur),(TCGArg)a3);
    }
    tcg_temp_free_internal_aarch64(s_00,(TCGTemp *)(var + (long)s_00));
  }
  else if (a->w == 0) {
    tcg_temp_free_internal_aarch64(s_00,(TCGTemp *)(addr + (long)s_00));
    return;
  }
  tcg_gen_addi_i32_aarch64(s_00,addr,addr,address_offset);
  store_reg(s,a->rn,addr);
  return;
}

Assistant:

static void op_addr_rr_post(DisasContext *s, arg_ldst_rr *a,
                            TCGv_i32 addr, int address_offset)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    if (!a->p) {
        TCGv_i32 ofs = load_reg(s, a->rm);
        gen_arm_shift_im(tcg_ctx, ofs, a->shtype, a->shimm, 0);
        if (a->u) {
            tcg_gen_add_i32(tcg_ctx, addr, addr, ofs);
        } else {
            tcg_gen_sub_i32(tcg_ctx, addr, addr, ofs);
        }
        tcg_temp_free_i32(tcg_ctx, ofs);
    } else if (!a->w) {
        tcg_temp_free_i32(tcg_ctx, addr);
        return;
    }
    tcg_gen_addi_i32(tcg_ctx, addr, addr, address_offset);
    store_reg(s, a->rn, addr);
}